

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_file.c
# Opt level: O1

int nni_plat_file_walk_inner(char *name,nni_plat_file_walker walkfn,void *arg,int flags,_Bool *stop)

{
  int iVar1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  int *piVar4;
  char *__s1;
  uint uVar5;
  undefined1 local_f8 [8];
  stat sbuf;
  char *local_40;
  char *path;
  
  sbuf.__glibc_reserved[2] = (__syscall_slong_t)name;
  path._4_4_ = flags;
  __dirp = opendir(name);
  if (__dirp == (DIR *)0x0) {
    piVar4 = __errno_location();
    iVar1 = nni_plat_errno(*piVar4);
    return iVar1;
  }
  pdVar3 = readdir(__dirp);
  if (pdVar3 != (dirent *)0x0) {
    __s1 = pdVar3->d_name;
    iVar1 = strcmp(__s1,".");
    uVar5 = 3;
    if (iVar1 != 0) {
      iVar1 = strcmp(__s1,"..");
      if (iVar1 != 0) {
        iVar1 = nni_asprintf(&local_40,"%s/%s",sbuf.__glibc_reserved[2],__s1);
        if (iVar1 != 0) {
          closedir(__dirp);
          iVar1 = (*(code *)&LAB_0011f854)();
          return iVar1;
        }
        iVar1 = stat(local_40,(stat *)local_f8);
        if (iVar1 == 0) {
          if (((path._4_4_ & 4) == 0) || (iVar1 = 0, ((uint)sbuf.st_nlink & 0xf000) == 0x8000)) {
            iVar1 = (*walkfn)(local_40,arg);
          }
          if (iVar1 == 1) {
            *stop = true;
          }
          if ((((path._4_4_ & 2) == 0) && (*stop == false)) &&
             (((uint)sbuf.st_nlink & 0xf000) == 0x4000)) {
            iVar2 = nni_plat_file_walk_inner(local_40,walkfn,arg,path._4_4_,stop);
            if (iVar2 != 0) {
              nni_strfree(local_40);
              closedir(__dirp);
              iVar1 = (*(code *)&LAB_0011f854)();
              return iVar1;
            }
          }
          nni_strfree(local_40);
          uVar5 = 2;
          if (iVar1 != 2) {
            uVar5 = (uint)*stop * 2;
          }
        }
        else {
          piVar4 = __errno_location();
          if (*piVar4 != 2) {
            nni_plat_errno(*piVar4);
            nni_strfree(local_40);
            closedir(__dirp);
            iVar1 = (*(code *)&LAB_0011f854)();
            return iVar1;
          }
        }
      }
    }
    iVar1 = (*(code *)(&DAT_00144470 + *(int *)(&DAT_00144470 + (ulong)uVar5 * 4)))();
    return iVar1;
  }
  closedir(__dirp);
  iVar1 = (*(code *)&LAB_0011f854)();
  return iVar1;
}

Assistant:

static int
nni_plat_file_walk_inner(const char *name, nni_plat_file_walker walkfn,
    void *arg, int flags, bool *stop)
{
	DIR *dir;

	if ((dir = opendir(name)) == NULL) {
		return (nni_plat_errno(errno));
	}
	for (;;) {
		int            rv;
		struct dirent *ent;
		struct stat    sbuf;
		char *         path;
		int            walkrv;

		if ((ent = readdir(dir)) == NULL) {
			closedir(dir);
			return (0);
		}
		// Skip "." and ".."  -- we would like to skip all
		// directories, but that would require checking full
		// paths.
		if ((strcmp(ent->d_name, ".") == 0) ||
		    (strcmp(ent->d_name, "..") == 0)) {
			continue;
		}
		if ((rv = nni_asprintf(&path, "%s/%s", name, ent->d_name)) !=
		    0) {
			closedir(dir);
			return (rv);
		}
		if (stat(path, &sbuf) != 0) {
			if (errno == ENOENT) { // deleted while walking
				continue;
			}
			rv = nni_plat_errno(errno);
			nni_strfree(path);
			closedir(dir);
			return (rv);
		}
		if (flags & NNI_PLAT_FILE_WALK_FILES_ONLY) {
			if ((sbuf.st_mode & S_IFMT) == S_IFREG) {
				walkrv = walkfn(path, arg);
			} else {
				walkrv = NNI_PLAT_FILE_WALK_CONTINUE;
			}
		} else {
			walkrv = walkfn(path, arg);
		}

		if (walkrv == NNI_PLAT_FILE_WALK_STOP) {
			*stop = true;
		}

		if ((!*stop) && (rv != NNI_PLAT_FILE_WALK_PRUNE_CHILD) &&
		    ((flags & NNI_PLAT_FILE_WALK_SHALLOW) == 0) &&
		    ((sbuf.st_mode & S_IFMT) == S_IFDIR)) {
			rv = nni_plat_file_walk_inner(
			    path, walkfn, arg, flags, stop);
			if (rv != 0) {
				nni_strfree(path);
				closedir(dir);
				return (rv);
			}
		}

		nni_strfree(path);

		if ((walkrv == NNI_PLAT_FILE_WALK_PRUNE_SIB) || (*stop)) {
			break;
		}
	}
	closedir(dir);
	return (0);
}